

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<chaiscript::Boxed_Number_(chaiscript::Boxed_Number),_chaiscript::dispatch::detail::Fun_Caller<chaiscript::Boxed_Number,_chaiscript::Boxed_Number>_>
::Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<chaiscript::Boxed_Number_(chaiscript::Boxed_Number),_chaiscript::dispatch::detail::Fun_Caller<chaiscript::Boxed_Number,_chaiscript::Boxed_Number>_>
           *this,Fun_Caller<chaiscript::Boxed_Number,_chaiscript::Boxed_Number> f)

{
  _func_Boxed_Number_Boxed_Number *in_RDX;
  _Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_30;
  
  detail::build_param_type_list<chaiscript::Boxed_Number,chaiscript::Boxed_Number>
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_30,
             (detail *)0x0,in_RDX);
  Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            (&this->super_Proxy_Function_Impl_Base,
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_30);
  std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~_Vector_base
            (&local_30);
  (this->super_Proxy_Function_Impl_Base).super_Proxy_Function_Base._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Proxy_Function_Base_00326bb0;
  (this->m_f).m_func = f.m_func;
  return;
}

Assistant:

Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr))),
            m_f(std::move(f))
        {
        }